

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypergraph.cpp
# Opt level: O1

void __thiscall
Hypergraph::enumerate(Hypergraph *this,edge *x,edge *y,size_type r,edge_vec *minimal_hitting_sets)

{
  char *pcVar1;
  edge *x_00;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  rep rVar5;
  ulong uVar6;
  long lVar7;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  edge yv;
  edge xv;
  allocator_type local_c9;
  time_point local_c8;
  Hypergraph *local_c0;
  size_type local_b8;
  edge *local_b0;
  string local_a8;
  string local_88;
  edge local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_68.m_bits,&x->m_bits);
  local_68.m_num_bits = x->m_num_bits;
  uVar4 = r >> 6;
  uVar6 = 1L << ((byte)r & 0x3f);
  local_68.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[uVar4] =
       local_68.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start[uVar4] | uVar6;
  local_b8 = r;
  local_b0 = x;
  iVar3 = extendable(this,&local_68,y);
  if (iVar3 == 0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_a8,&y->m_bits);
    local_a8.field_2._8_8_ = y->m_num_bits;
    *(ulong *)(local_a8._M_dataplus._M_p + uVar4 * 8) =
         *(ulong *)(local_a8._M_dataplus._M_p + uVar4 * 8) | uVar6;
    enumerate(this,local_b0,(edge *)&local_a8,local_b8 + 1,minimal_hitting_sets);
    bVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_check_invariants
                      ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_a8);
  }
  else {
    if (iVar3 == 1) {
      enumerate(this,&local_68,y,local_b8 + 1,minimal_hitting_sets);
    }
    else if (iVar3 == 2) {
      std::
      vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::push_back(minimal_hitting_sets,&local_68);
      if ((this->m_configuration).collect_hitting_set_statistics == true) {
        local_c0 = this;
        local_c8.__d.__r = (duration)std::chrono::_V2::system_clock::now();
        edge_to_string_abi_cxx11_(&local_a8,&local_68);
        ns_string_abi_cxx11_
                  (&local_88,(time_point)(local_c0->m_hitting_set_timestamp).__d.__r,local_c8);
        __l._M_len = 2;
        __l._M_array = &local_a8;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_48,__l,&local_c9);
        local_c8.__d.__r = (duration)(duration)minimal_hitting_sets;
        Table::add_record(&local_c0->m_hitting_set_stats,&local_48);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_48);
        lVar7 = 0;
        do {
          pcVar1 = *(char **)((long)&local_88._M_dataplus._M_p + lVar7);
          if (local_88.field_2._M_local_buf + lVar7 != pcVar1) {
            operator_delete(pcVar1);
          }
          lVar7 = lVar7 + -0x20;
        } while (lVar7 != -0x40);
        rVar5 = std::chrono::_V2::system_clock::now();
        (local_c0->m_hitting_set_timestamp).__d.__r = rVar5;
        this = local_c0;
        minimal_hitting_sets = (edge_vec *)local_c8;
      }
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_a8,&y->m_bits);
    x_00 = local_b0;
    local_a8.field_2._8_8_ = y->m_num_bits;
    *(ulong *)(local_a8._M_dataplus._M_p + uVar4 * 8) =
         *(ulong *)(local_a8._M_dataplus._M_p + uVar4 * 8) | uVar6;
    iVar3 = extendable(this,local_b0,(edge *)&local_a8);
    if (iVar3 != 0) {
      enumerate(this,x_00,(edge *)&local_a8,local_b8 + 1,minimal_hitting_sets);
    }
    bVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_check_invariants
                      ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_a8);
  }
  if (bVar2 != false) {
    if (local_a8._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    bVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_check_invariants
                      (&local_68);
    if (bVar2) {
      if (local_68.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.m_bits.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      return;
    }
  }
  __assert_fail("m_check_invariants()","/usr/include/boost/dynamic_bitset/dynamic_bitset.hpp",0x2be,
                "boost::dynamic_bitset<>::~dynamic_bitset() [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
               );
}

Assistant:

void Hypergraph::enumerate(const edge &x, const edge &y, edge::size_type r, edge_vec &minimal_hitting_sets) {
	edge xv = x;
	xv[r] = 1;
	switch (extendable(xv, y)) {
	case MINIMAL:
	{
		minimal_hitting_sets.push_back(xv);
		if (m_configuration.collect_hitting_set_statistics) {
			auto now = Clock::now();
			m_hitting_set_stats.add_record({ edge_to_string(xv), ns_string(m_hitting_set_timestamp, now) });
			m_hitting_set_timestamp = Clock::now();
		}
		break;
	}
	case EXTENDABLE:
		enumerate(xv, y, r + 1, minimal_hitting_sets);
		break;
	case NOT_EXTENDABLE:
		edge yv = y;
		yv[r] = 1;
		enumerate(x, yv, r + 1, minimal_hitting_sets);
		return;
	}
	edge yv = y;
	yv[r] = 1;
	if (extendable(x, yv)) enumerate(x, yv, r + 1, minimal_hitting_sets);
}